

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall Minisat::Solver::satisfied(Solver *this,Clause *c)

{
  int iVar1;
  lbool *plVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  if ((this->assumptions).sz == 0) {
    uVar3 = (ulong)c->header >> 0x22;
    if (uVar3 == 0) {
      return false;
    }
    lVar4 = 0;
    do {
      iVar1 = *(int *)(&c[1].header.field_0x0 + lVar4 * 4);
      bVar5 = (this->assigns).data[iVar1 >> 1].value == ((byte)iVar1 & 1);
      if (bVar5) {
        return bVar5;
      }
      bVar6 = uVar3 - 1 != lVar4;
      lVar4 = lVar4 + 1;
    } while (bVar6);
  }
  else {
    plVar2 = (this->assigns).data;
    bVar5 = true;
    if (plVar2[*(int *)&c[1].header >> 1].value != ((byte)*(int *)&c[1].header & 1)) {
      iVar1 = *(int *)&c[1].header.field_0x4;
      bVar5 = plVar2[iVar1 >> 1].value == ((byte)iVar1 & 1);
    }
  }
  return bVar5;
}

Assistant:

bool Solver::satisfied(const Clause &c) const
{
    if (assumptions.size()) // Check clauses with many selectors is too time consuming
        return (value(c[0]) == l_True) || (value(c[1]) == l_True);

    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True) return true;
    return false;
}